

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall ncnn::Extractor::Extractor(Extractor *this,Net *_net,size_t blob_count)

{
  Option *this_00;
  Net *pNVar1;
  Allocator *pAVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined3 uVar12;
  int iVar13;
  
  this->net = _net;
  (this->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->opt;
  Option::Option(this_00);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(&this->blob_mats,blob_count);
  pNVar1 = this->net;
  bVar3 = (pNVar1->opt).use_fp16_arithmetic;
  bVar4 = (pNVar1->opt).use_int8_storage;
  bVar5 = (pNVar1->opt).use_int8_arithmetic;
  bVar6 = (pNVar1->opt).use_packing_layout;
  bVar7 = (pNVar1->opt).use_shader_pack8;
  bVar8 = (pNVar1->opt).use_image_storage;
  bVar9 = (pNVar1->opt).use_bf16_storage;
  (this->opt).use_fp16_storage = (pNVar1->opt).use_fp16_storage;
  (this->opt).use_fp16_arithmetic = bVar3;
  (this->opt).use_int8_storage = bVar4;
  (this->opt).use_int8_arithmetic = bVar5;
  (this->opt).use_packing_layout = bVar6;
  (this->opt).use_shader_pack8 = bVar7;
  (this->opt).use_image_storage = bVar8;
  (this->opt).use_bf16_storage = bVar9;
  bVar11 = (pNVar1->opt).lightmode;
  uVar12 = *(undefined3 *)&(pNVar1->opt).field_0x1;
  iVar13 = (pNVar1->opt).num_threads;
  pAVar2 = (pNVar1->opt).blob_allocator;
  bVar3 = (pNVar1->opt).use_winograd_convolution;
  bVar4 = (pNVar1->opt).use_sgemm_convolution;
  bVar5 = (pNVar1->opt).use_int8_inference;
  bVar6 = (pNVar1->opt).use_vulkan_compute;
  bVar7 = (pNVar1->opt).use_fp16_packed;
  bVar8 = (pNVar1->opt).use_fp16_storage;
  bVar9 = (pNVar1->opt).use_fp16_arithmetic;
  bVar10 = (pNVar1->opt).use_int8_storage;
  (this->opt).workspace_allocator = (pNVar1->opt).workspace_allocator;
  (this->opt).use_winograd_convolution = bVar3;
  (this->opt).use_sgemm_convolution = bVar4;
  (this->opt).use_int8_inference = bVar5;
  (this->opt).use_vulkan_compute = bVar6;
  (this->opt).use_fp16_packed = bVar7;
  (this->opt).use_fp16_storage = bVar8;
  (this->opt).use_fp16_arithmetic = bVar9;
  (this->opt).use_int8_storage = bVar10;
  this_00->lightmode = bVar11;
  *(undefined3 *)&this_00->field_0x1 = uVar12;
  this_00->num_threads = iVar13;
  (this->opt).blob_allocator = pAVar2;
  return;
}

Assistant:

Extractor::Extractor(const Net* _net, size_t blob_count) : net(_net)
{
    blob_mats.resize(blob_count);
    opt = net->opt;

#if NCNN_VULKAN
    if (net->opt.use_vulkan_compute)
    {
        local_blob_vkallocator = 0;
        local_staging_vkallocator = 0;

        blob_mats_gpu.resize(blob_count);
        blob_mats_gpu_image.resize(blob_count);
    }
#endif // NCNN_VULKAN
}